

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenRegex(cmSourceGroup *this,char *name)

{
  cmSourceGroup *pcVar1;
  bool bVar2;
  cmSourceGroup *pcVar3;
  cmSourceGroup *pcVar4;
  
  pcVar4 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pcVar4 == pcVar1) {
      bVar2 = cmsys::RegularExpression::find(&this->GroupRegex,name);
      pcVar4 = (cmSourceGroup *)0x0;
      if (bVar2) {
        pcVar4 = this;
      }
      return pcVar4;
    }
    pcVar3 = MatchChildrenRegex(pcVar4,name);
    if (pcVar3 != (cmSourceGroup *)0x0) break;
    pcVar4 = pcVar4 + 1;
  }
  return pcVar3;
}

Assistant:

cmSourceGroup *cmSourceGroup::MatchChildrenRegex(const char *name)
{
  // initializing iterators
  std::vector<cmSourceGroup>::iterator iter =
    this->Internal->GroupChildren.begin();
  std::vector<cmSourceGroup>::iterator end =
    this->Internal->GroupChildren.end();

  for(;iter!=end; ++iter)
    {
    cmSourceGroup *result = iter->MatchChildrenRegex(name);
    if(result)
      {
      return result;
      }
    }
  if(this->MatchesRegex(name))
    {
    return this;
    }

  return 0;
}